

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_smin_i32_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 b_local;
  TCGv_i32 a_local;
  TCGv_i32 ret_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  tcg_gen_movcond_i32_mips(tcg_ctx,TCG_COND_LT,ret,a,b,a,b);
  return;
}

Assistant:

void tcg_gen_smin_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, ret, a, b, a, b);
}